

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int match_list(int *acc,char **str,size_t *len,char *lst,size_t lstlen,date_parse_string *capture)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  size_t sVar7;
  byte *pbVar8;
  size_t sVar9;
  bool bVar10;
  char *curstr;
  size_t curlen;
  date_parse_string part;
  int local_88;
  int local_84;
  ulong local_78;
  char *local_68;
  int *local_60;
  date_parse_string *local_58;
  size_t local_50;
  date_parse_string local_48;
  
  local_60 = acc;
  local_58 = capture;
  if (lstlen != 0) {
    pbVar3 = (byte *)(lst + lstlen);
    do {
      if ((*lst < '\0') || (iVar2 = isspace((int)*lst), iVar2 == 0)) goto LAB_0028ccb4;
      lst = (char *)((byte *)lst + 1);
      lstlen = lstlen - 1;
    } while (lstlen != 0);
    lstlen = 0;
    lst = (char *)pbVar3;
  }
LAB_0028ccb4:
  local_84 = 1;
  local_78 = 0;
  local_88 = 0;
  do {
    if (lstlen == 0) break;
    bVar10 = false;
    pbVar3 = (byte *)lst;
    sVar7 = lstlen;
    do {
      if (((ulong)*pbVar3 < 0x3e) && ((0x2800100000000000U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))
      goto LAB_0028cd13;
      pbVar3 = pbVar3 + 1;
      sVar7 = sVar7 - 1;
      bVar10 = sVar7 == 0;
    } while (!bVar10);
    sVar7 = 0;
    pbVar3 = (byte *)lst + lstlen;
LAB_0028cd13:
    local_68 = *str;
    local_50 = *len;
    local_48.p = (char *)0x0;
    local_48.len = 0;
    if (((long)pbVar3 - (long)lst != 0) &&
       (iVar2 = match_lit(&local_68,&local_50,lst,(long)pbVar3 - (long)lst,&local_48), iVar2 != 0))
    {
      uVar4 = (long)local_68 - (long)*str;
      lVar5 = (long)(int)local_78;
      if (lVar5 < (long)uVar4) {
        local_78 = uVar4;
      }
      local_78 = local_78 & 0xffffffff;
      if (lVar5 < (long)uVar4) {
        local_88 = local_84;
      }
    }
    if (bVar10) {
LAB_0028cd8c:
      bVar10 = false;
    }
    else {
      bVar1 = *pbVar3;
      if (bVar1 == 0x2c) {
        local_84 = local_84 + 1;
        pbVar6 = pbVar3 + sVar7;
        pbVar8 = pbVar3;
        sVar9 = sVar7;
        do {
          sVar9 = sVar9 - 1;
          pbVar3 = pbVar3 + 1;
          bVar10 = true;
          if (sVar9 == 0) {
            lst = (char *)pbVar6;
            lstlen = 0;
            break;
          }
          lst = (char *)pbVar3;
          lstlen = sVar9;
          if ((char)*pbVar3 < '\0') break;
          lst = (char *)(pbVar8 + 1);
          iVar2 = isspace((int)(char)*pbVar3);
          sVar7 = sVar7 - 1;
          lstlen = sVar7;
          pbVar8 = (byte *)lst;
        } while (iVar2 != 0);
      }
      else {
        if (bVar1 == 0x3d) {
          pbVar3 = pbVar3 + 1;
          sVar7 = sVar7 - 1;
        }
        else if (bVar1 == 0x3b) goto LAB_0028cd8c;
        bVar10 = true;
        lst = (char *)pbVar3;
        lstlen = sVar7;
      }
    }
  } while (bVar10);
  if ((int)local_78 != 0) {
    local_58->p = *str;
    sVar7 = (size_t)(int)local_78;
    local_58->len = sVar7;
    *local_60 = local_88;
    *str = *str + sVar7;
    *len = *len - sVar7;
  }
  return (uint)((int)local_78 != 0);
}

Assistant:

static int match_list(int &acc, const char *&str, size_t &len,
                      const char *lst, size_t lstlen,
                      date_parse_string &capture)
{
    /* no matches yet */
    int bestlen = 0;
    int bestidx = 0;

    /* skip leading spaces */
    for ( ; lstlen != 0 && is_space(*lst) ; ++lst, --lstlen) ;
    
    /* keep going until we're out of list */
    for (int idx = 1 ; lstlen != 0 ; )
    {
        /* find the next delimiter */
        const char *p = lst;
        size_t rem = lstlen;
        for ( ; rem != 0 && *p != '=' && *p != ',' && *p != ';' ; ++p, --rem) ;

        /* try matching this text */
        const char *curstr = str;
        size_t curlen = len;
        date_parse_string part;
        if (p - lst != 0 && match_lit(curstr, curlen, lst, p - lst, part))
        {
            /* if this is the best one so far, remember it */
            if (curstr - str > bestlen)
            {
                bestlen = curstr - str;
                bestidx = idx;
            }
        }

        /* 
         *   If we're at an '=', an alias for this same item follows, so keep
         *   going without upping the index.  If we're at a comma, we're on
         *   to the next item.  If we're at a ';' or the end of the string,
         *   it's the end of the list, so we've failed to find a match.
         */
        if (rem == 0 || *p == ';')
        {
            /* end of the list */
            break;
        }
        else if (*p == ',')
        {
            /* next list item follows - up the index */
            ++idx;

            /* skip the comma and any spaces before the next item */
            for (++p, --rem ; rem != 0 && is_space(*p) ; ++p, --rem) ;
        }
        else if (*p == '=')
        {
            /* alias - just skip the '=' */
            ++p, --rem;
        }

        /* on to the next item */
        lst = p;
        lstlen = rem;
    }

    /* if we found a match, return it */
    if (bestlen != 0)
    {
        capture.p = str;
        capture.len = bestlen;
        acc = bestidx;
        str += bestlen;
        len -= bestlen;
        return TRUE;
    }
    else
        return FALSE;
}